

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traversal_algorithm.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::traversal_algorithm::finished(traversal_algorithm *this,observer_ptr *o)

{
  byte bVar1;
  element_type *peVar2;
  bool bVar3;
  
  peVar2 = (o->super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  bVar1 = (peVar2->flags).m_val;
  if ((bVar1 & 8) != 0) {
    this->m_branch_factor = this->m_branch_factor + -1;
  }
  (peVar2->flags).m_val = bVar1 | 0x40;
  this->m_responses = this->m_responses + 1;
  this->m_invoke_count = this->m_invoke_count + -1;
  bVar3 = add_requests(this);
  if (bVar3) {
    (*this->_vptr_traversal_algorithm[4])(this);
    return;
  }
  return;
}

Assistant:

void traversal_algorithm::finished(observer_ptr o)
{
#if TORRENT_USE_ASSERTS
	auto i = std::find(m_results.begin(), m_results.end(), o);
	TORRENT_ASSERT(i != m_results.end());
#endif

	// if this flag is set, it means we increased the
	// branch factor for it, and we should restore it
	if (o->flags & observer::flag_short_timeout)
	{
		TORRENT_ASSERT(m_branch_factor > 0);
		--m_branch_factor;
	}

	TORRENT_ASSERT((o->flags & (observer::flag_queried
		| observer::flag_alive
		| observer::flag_failed
		)) == observer::flag_queried);
	o->flags |= observer::flag_alive;

	++m_responses;
	TORRENT_ASSERT(m_invoke_count > 0);
	--m_invoke_count;
	bool const is_done = add_requests();
	if (is_done) done();
}